

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libntlmconnect.c
# Opt level: O0

int test(char *url)

{
  bool bVar1;
  bool bVar2;
  FILE *pFVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  char *__s;
  undefined8 uVar7;
  CURL *pCVar8;
  long lVar9;
  uint *puVar10;
  char *pcVar11;
  timeval tVar12;
  timeval older;
  timeval older_00;
  int ec_15;
  CURLMcode ec_14;
  _Bool socket_exists;
  CURLMcode ec_13;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  CURLMcode ec_12;
  CURLMcode ec_11;
  CURLcode ec_10;
  CURLcode ec_9;
  CURLcode ec_8;
  CURLcode ec_7;
  CURLcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  uint uStack_1f4;
  _Bool found_new_socket;
  curl_socket_t maxfd;
  curl_socket_t curfd;
  long timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  timeval interval;
  __time_t _Stack_50;
  CURLcode ec;
  __suseconds_t local_48;
  char *full_url;
  uint local_30;
  HandleState state;
  int num_handles;
  int j;
  int i;
  int running;
  CURLM *multi;
  char *url_local;
  
  _i = 0;
  local_30 = 0;
  full_url._4_4_ = 0;
  multi = url;
  sVar6 = strlen(url);
  __s = (char *)malloc(sVar6 + 5);
  tVar12 = tutil_tvnow();
  _Stack_50 = tVar12.tv_sec;
  tv_test_start.tv_sec = _Stack_50;
  local_48 = tVar12.tv_usec;
  tv_test_start.tv_usec = local_48;
  if (__s == (char *)0x0) {
    fprintf(_stderr,"Not enough memory for full url\n");
    url_local._4_4_ = 0x1b;
  }
  else {
    for (num_handles = 0; num_handles < 3; num_handles = num_handles + 1) {
      easy[num_handles] = (CURL *)0x0;
      sockets[num_handles] = -1;
    }
    res = 0;
    uVar4 = curl_global_init(3);
    pFVar3 = _stderr;
    if (uVar4 != 0) {
      uVar7 = curl_easy_strerror(uVar4);
      fprintf(pFVar3,"%s:%d curl_global_init() failed, with code %d (%s)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
              ,0x6d,(ulong)uVar4,uVar7);
      res = uVar4;
    }
    if (res == 0) {
      _i = curl_multi_init();
      if (_i == 0) {
        fprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                ,0x72);
        res = 0x7b;
      }
joined_r0x00102482:
      if (res == 0) {
        do {
          _maxfd = -99;
          ec_1 = ~CURLE_OK;
          bVar2 = false;
          if (full_url._4_4_ == 0) {
            pCVar8 = (CURL *)curl_easy_init();
            easy[(int)local_30] = pCVar8;
            if (pCVar8 == (CURL *)0x0) {
              fprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,0x7f);
              res = 0x7c;
            }
            if (res != 0) break;
            if ((int)local_30 % 3 == 2) {
              sprintf(__s,"%s0200",multi);
              uVar4 = curl_easy_setopt(easy[(int)local_30],0x6b,8);
              pFVar3 = _stderr;
              if (uVar4 != 0) {
                uVar7 = curl_easy_strerror(uVar4);
                fprintf(pFVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                        ,0x83,(ulong)uVar4,uVar7);
                res = uVar4;
              }
            }
            else {
              sprintf(__s,"%s0100",multi);
              uVar4 = curl_easy_setopt(easy[(int)local_30],0x6b,1);
              pFVar3 = _stderr;
              if (uVar4 != 0) {
                uVar7 = curl_easy_strerror(uVar4);
                fprintf(pFVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                        ,0x86,(ulong)uVar4,uVar7);
                res = uVar4;
              }
            }
            if (res != 0) break;
            uVar4 = curl_easy_setopt(easy[(int)local_30],0x4a,1);
            pFVar3 = _stderr;
            if (uVar4 != 0) {
              uVar7 = curl_easy_strerror(uVar4);
              fprintf(pFVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,0x88,(ulong)uVar4,uVar7);
              res = uVar4;
            }
            if (res != 0) break;
            uVar4 = curl_easy_setopt(easy[(int)local_30],0x2712,__s);
            pFVar3 = _stderr;
            if (uVar4 != 0) {
              uVar7 = curl_easy_strerror(uVar4);
              fprintf(pFVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,0x89,(ulong)uVar4,uVar7);
              res = uVar4;
            }
            if (res != 0) break;
            uVar4 = curl_easy_setopt(easy[(int)local_30],0x29,1);
            pFVar3 = _stderr;
            if (uVar4 != 0) {
              uVar7 = curl_easy_strerror(uVar4);
              fprintf(pFVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,0x8a,(ulong)uVar4,uVar7);
              res = uVar4;
            }
            if (res != 0) break;
            uVar4 = curl_easy_setopt(easy[(int)local_30],0x50,1);
            pFVar3 = _stderr;
            if (uVar4 != 0) {
              uVar7 = curl_easy_strerror(uVar4);
              fprintf(pFVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,0x8b,(ulong)uVar4,uVar7);
              res = uVar4;
            }
            if (res != 0) break;
            uVar4 = curl_easy_setopt(easy[(int)local_30],0x2715,"testuser:testpass");
            pFVar3 = _stderr;
            if (uVar4 != 0) {
              uVar7 = curl_easy_strerror(uVar4);
              fprintf(pFVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,0x8c,(ulong)uVar4,uVar7);
              res = uVar4;
            }
            if (res != 0) break;
            uVar4 = curl_easy_setopt(easy[(int)local_30],0x4e2b,callback);
            pFVar3 = _stderr;
            if (uVar4 != 0) {
              uVar7 = curl_easy_strerror(uVar4);
              fprintf(pFVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,0x8d,(ulong)uVar4,uVar7);
              res = uVar4;
            }
            if (res != 0) break;
            uVar4 = curl_easy_setopt(easy[(int)local_30],0x2711,easy + (int)local_30);
            pFVar3 = _stderr;
            if (uVar4 != 0) {
              uVar7 = curl_easy_strerror(uVar4);
              fprintf(pFVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,0x8e,(ulong)uVar4,uVar7);
              res = uVar4;
            }
            if (res != 0) break;
            uVar4 = curl_easy_setopt(easy[(int)local_30],0x2a,1);
            pFVar3 = _stderr;
            if (uVar4 != 0) {
              uVar7 = curl_easy_strerror(uVar4);
              fprintf(pFVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,0x8f,(ulong)uVar4,uVar7);
              res = uVar4;
            }
            if (res != 0) break;
            uVar4 = curl_multi_add_handle(_i,easy[(int)local_30]);
            pFVar3 = _stderr;
            if (uVar4 != 0) {
              uVar7 = curl_multi_strerror(uVar4);
              fprintf(pFVar3,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,0x91,(ulong)uVar4,uVar7);
              res = uVar4;
            }
            if (res != 0) break;
            local_30 = local_30 + 1;
            full_url._4_4_ = 1;
          }
          uVar4 = curl_multi_perform(_i,&j);
          pFVar3 = _stderr;
          if (uVar4 == 0) {
            if (j < 0) {
              fprintf(_stderr,
                      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,0x96,(ulong)(uint)j);
              res = 0x7a;
            }
          }
          else {
            uVar7 = curl_multi_strerror(uVar4);
            fprintf(pFVar3,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                    ,0x96,(ulong)uVar4,uVar7);
            res = uVar4;
          }
          if (res != 0) break;
          tVar12 = tutil_tvnow();
          older.tv_usec = tv_test_start.tv_usec;
          older.tv_sec = tv_test_start.tv_sec;
          lVar9 = tutil_tvdiff(tVar12,older);
          if (5000 < lVar9) {
            fprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                    ,0x9a);
            res = 0x7d;
          }
          if ((res != 0) || ((j == 0 && (full_url._4_4_ == 2)))) break;
          for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
            fdwrite.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
          }
          for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
            fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
          }
          for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
            fdexcep.__fds_bits[(ulong)__arr_2._4_4_ - 1] = 0;
          }
          uVar4 = curl_multi_fdset(_i,fdwrite.__fds_bits + 0xf,fdexcep.__fds_bits + 0xf,&timeout,
                                   &ec_1);
          pFVar3 = _stderr;
          if (uVar4 == 0) {
            if ((int)ec_1 < -1) {
              fprintf(_stderr,
                      "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,0xa3,(ulong)ec_1);
              res = 0x7a;
            }
          }
          else {
            uVar7 = curl_multi_strerror(uVar4);
            fprintf(pFVar3,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                    ,0xa3,(ulong)uVar4,uVar7);
            res = uVar4;
          }
          if (res != 0) break;
          for (uStack_1f4 = 0; (int)uStack_1f4 <= (int)ec_1; uStack_1f4 = uStack_1f4 + 1) {
            bVar1 = false;
            if ((fdwrite.__fds_bits[(long)((int)uStack_1f4 / 0x40) + 0xf] &
                1L << ((byte)((long)(int)uStack_1f4 % 0x40) & 0x3f)) != 0) {
              for (state = ReadyForNewHandle; (int)state < (int)local_30;
                  state = state + NeedSocketForNewHandle) {
                if (sockets[(int)state] == uStack_1f4) {
                  bVar1 = true;
                  break;
                }
              }
              if (!bVar1) {
                if ((bVar2) || (full_url._4_4_ != 1)) {
                  fprintf(_stderr,"Unexpected new socket\n");
                  res = 0x7e;
                  goto LAB_00103432;
                }
                if (sockets[(int)(local_30 - 1)] != -1) {
                  if (uStack_1f4 == sockets[(int)(local_30 - 1)]) {
                    __assert_fail("curfd != sockets[num_handles-1]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                                  ,0xc4,"int test(char *)");
                  }
                  fprintf(_stderr,"Handle %d wrote to socket %d then detected on %d\n",
                          (ulong)(local_30 - 1),(ulong)(uint)sockets[(int)(local_30 - 1)],
                          (ulong)uStack_1f4);
                  res = 0x7e;
                  goto LAB_00103432;
                }
                sockets[(int)(local_30 - 1)] = uStack_1f4;
                bVar2 = true;
              }
            }
          }
          if (full_url._4_4_ != 1) goto LAB_00103199;
          if ((ec_1 == ~CURLE_OK) || (bVar2)) goto LAB_00103186;
          fprintf(_stderr,"Warning: socket did not open immediately for new handle (trying again)\n"
                 );
        } while( true );
      }
LAB_00103432:
      for (num_handles = 0; num_handles < 3; num_handles = num_handles + 1) {
        if (easy[num_handles] != (CURL *)0x0) {
          if (_i != 0) {
            curl_multi_remove_handle(_i,easy[num_handles]);
          }
          curl_easy_cleanup(easy[num_handles]);
        }
      }
      if (_i != 0) {
        curl_multi_cleanup(_i);
      }
      curl_global_cleanup();
      if (__s != (char *)0x0) {
        free(__s);
      }
      url_local._4_4_ = res;
    }
    else {
      url_local._4_4_ = res;
    }
  }
  return url_local._4_4_;
LAB_00103186:
  full_url._4_4_ = 2;
  if ((int)local_30 < 3) {
    full_url._4_4_ = 0;
  }
LAB_00103199:
  uVar4 = curl_multi_timeout(_i,&maxfd);
  pFVar3 = _stderr;
  if (uVar4 == 0) {
    if (_maxfd < -1) {
      fprintf(_stderr,
              "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
              ,0xdb,_maxfd);
      res = 0x73;
    }
  }
  else {
    uVar7 = curl_multi_strerror(uVar4);
    fprintf(pFVar3,"%s:%d curl_multi_timeout() failed, with code %d (%s)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
            ,0xdb,(ulong)uVar4,uVar7);
    res = uVar4;
  }
  if (res != 0) goto LAB_00103432;
  fprintf(_stderr,"%s:%d num_handles %d timeout %ld\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
          ,0xe0,(ulong)local_30,_maxfd);
  if (_maxfd == -1) {
    fdread.__fds_bits[0xf] = 6;
    if ((j == 0) && (local_30 == 3)) goto LAB_00103432;
  }
  else {
    fdread.__fds_bits[0xf] = _maxfd / 1000;
  }
  iVar5 = select_wrapper(ec_1 + CURLE_UNSUPPORTED_PROTOCOL,(fd_set *)(fdwrite.__fds_bits + 0xf),
                         (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)&timeout,
                         (timeval *)(fdread.__fds_bits + 0xf));
  if (iVar5 == -1) {
    puVar10 = (uint *)__errno_location();
    pFVar3 = _stderr;
    uVar4 = *puVar10;
    pcVar11 = strerror(uVar4);
    fprintf(pFVar3,"%s:%d select() failed, with errno %d (%s)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
            ,0xf2,(ulong)uVar4,pcVar11);
    res = 0x79;
  }
  if (res != 0) goto LAB_00103432;
  tVar12 = tutil_tvnow();
  older_00.tv_usec = tv_test_start.tv_usec;
  older_00.tv_sec = tv_test_start.tv_sec;
  lVar9 = tutil_tvdiff(tVar12,older_00);
  if (5000 < lVar9) {
    fprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
            ,0xf4);
    res = 0x7d;
  }
  goto joined_r0x00102482;
}

Assistant:

int test(char *url)
{
  CURLM *multi = NULL;
  int running;
  int i, j;
  int num_handles = 0;
  enum HandleState state = ReadyForNewHandle;
  char* full_url = malloc(strlen(url) + 4 + 1);

  start_test_timing();

  if (!full_url) {
    fprintf(stderr, "Not enough memory for full url\n");
    return CURLE_OUT_OF_MEMORY;
  }

  for (i = 0; i < MAX_EASY_HANDLES; ++i) {
    easy[i] = NULL;
    sockets[i] = -1;
  }

  res = 0;
  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    return res;
  }

  multi_init(multi);

  for(;;) {
    struct timeval interval;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    long timeout = -99;
    curl_socket_t curfd, maxfd = INVALID_SOCKET;
    bool found_new_socket = FALSE;

    /* Start a new handle if we aren't at the max */
    if (state == ReadyForNewHandle) {
      easy_init(easy[num_handles]);

      if (num_handles % 3 == 2) {
        sprintf(full_url, "%s0200", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_NTLM);
      } else {
        sprintf(full_url, "%s0100", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
      }
      easy_setopt(easy[num_handles], CURLOPT_FRESH_CONNECT, 1L);
      easy_setopt(easy[num_handles], CURLOPT_URL, full_url);
      easy_setopt(easy[num_handles], CURLOPT_VERBOSE, 1L);
      easy_setopt(easy[num_handles], CURLOPT_HTTPGET, 1L);
      easy_setopt(easy[num_handles], CURLOPT_USERPWD, "testuser:testpass");
      easy_setopt(easy[num_handles], CURLOPT_WRITEFUNCTION, callback);
      easy_setopt(easy[num_handles], CURLOPT_WRITEDATA, easy + num_handles);
      easy_setopt(easy[num_handles], CURLOPT_HEADER, 1L);

      multi_add_handle(multi, easy[num_handles]);
      num_handles += 1;
      state = NeedSocketForNewHandle;
    }

    multi_perform(multi, &running);
    if (0 != res)
      break;

    abort_on_test_timeout();

    if(!running && state == NoMoreHandles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, (int *)&maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    /* Any socket which is new in fdread is associated with the new handle */
    for (curfd = 0; curfd <= maxfd; ++curfd) {
      bool socket_exists = FALSE;
      if (!FD_ISSET(curfd, &fdread)) {
        continue;
      }

      /* Check if this socket was already detected for an earlier handle (or
         for this handle, num_handles-1, in the callback */
      for (j = 0; j < num_handles; ++j) {
        if (sockets[j] == curfd) {
          socket_exists = TRUE;
          break;
        }
      }
      if (socket_exists) {
        continue;
      }

      if (found_new_socket || state != NeedSocketForNewHandle) {
        fprintf(stderr, "Unexpected new socket\n");
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }

      /* Now we know the socket is for the most recent handle, num_handles-1 */
      if (sockets[num_handles-1] != INVALID_SOCKET) {
        /* A socket for this handle was already detected in the callback; if it
           matched socket_exists should be true and we would never get here */
        assert(curfd != sockets[num_handles-1]);
        fprintf(stderr, "Handle %d wrote to socket %d then detected on %d\n",
                num_handles-1, sockets[num_handles-1], curfd);
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }
      else {
        sockets[num_handles-1] = curfd;
        found_new_socket = TRUE;
        /* continue to make sure there's only one new handle */
      }
    }

    if (state == NeedSocketForNewHandle) {
      if(maxfd != -1 && !found_new_socket) {
        fprintf(stderr, "Warning: socket did not open immediately for new "
                "handle (trying again)\n");
        continue;
      }
      state = num_handles < MAX_EASY_HANDLES ? ReadyForNewHandle
                                             : NoMoreHandles;
    }

    multi_timeout(multi, &timeout);

    /* At this point, timeout is guaranteed to be greater or equal than -1. */

    fprintf(stderr, "%s:%d num_handles %d timeout %ld\n",
            __FILE__, __LINE__, num_handles, timeout);

    if(timeout != -1L) {
      interval.tv_sec = timeout/1000;
      interval.tv_usec = (timeout%1000)*1000;
    }
    else {
      interval.tv_sec = TEST_HANG_TIMEOUT/1000+1;
      interval.tv_usec = 0;

      /* if there's no timeout and we get here on the last handle, we may
         already have read the last part of the stream so waiting makes no
         sense */
      if(!running && num_handles == MAX_EASY_HANDLES) {
        break;
      }
    }

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  for (i = 0; i < MAX_EASY_HANDLES; ++i) {
    if (easy[i]) {
       if (multi) {
         curl_multi_remove_handle(multi, easy[i]);
       }
       curl_easy_cleanup(easy[i]);
    }
  }

  if (multi) {
    curl_multi_cleanup(multi);
  }

  curl_global_cleanup();

  if (full_url) {
    free(full_url);
  }

  return res;
}